

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_mul(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
                   _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *X;
  mbedtls_mpi *Y;
  mbedtls_mpi *X_00;
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong d;
  size_t pos;
  uchar swap;
  byte bVar4;
  uint uVar5;
  mbedtls_ecp_point *pmVar6;
  mbedtls_ecp_point *R_00;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  mbedtls_ecp_point *local_298;
  byte local_28c;
  mbedtls_mpi A;
  mbedtls_mpi AA;
  mbedtls_mpi E;
  mbedtls_mpi B;
  mbedtls_mpi D;
  mbedtls_mpi BB;
  mbedtls_ecp_point RP;
  mbedtls_mpi local_90;
  mbedtls_mpi DA;
  mbedtls_mpi C;
  mbedtls_mpi local_48;
  
  iVar1 = mbedtls_mpi_cmp_int(&P->Z,1);
  if (iVar1 != 0) {
    return -0x4f80;
  }
  iVar1 = mbedtls_ecp_check_privkey(grp,m);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mbedtls_ecp_check_pubkey(grp,P);
  if (iVar1 != 0) {
    return iVar1;
  }
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return 0;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    mbedtls_mpi_init(&RP.X);
    mbedtls_mpi_init(&RP.Y);
    mbedtls_mpi_init(&RP.Z);
    mbedtls_mpi_init(&local_48);
    iVar1 = mbedtls_mpi_copy(&local_48,&P->X);
    if (((iVar1 == 0) && (iVar1 = mbedtls_ecp_copy(&RP,P), iVar1 == 0)) &&
       (iVar1 = mbedtls_mpi_lset(&R->X,1), iVar1 == 0)) {
      X = &R->Z;
      iVar1 = mbedtls_mpi_lset(X,0);
      if (iVar1 == 0) {
        mbedtls_mpi_free(&R->Y);
        Y = &grp->P;
        do {
          iVar1 = mbedtls_mpi_cmp_mpi(&RP.X,Y);
          if (iVar1 < 0) {
            if ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
               (iVar1 = ecp_randomize_mxz(grp,&RP,f_rng,p_rng), iVar1 == 0)) {
              pos = mbedtls_mpi_bitlen(m);
              goto LAB_00123186;
            }
            break;
          }
          iVar1 = mbedtls_mpi_sub_abs(&RP.X,&RP.X,Y);
        } while (iVar1 == 0);
      }
    }
LAB_001239a5:
    mbedtls_mpi_free(&RP.X);
    mbedtls_mpi_free(&RP.Y);
    mbedtls_mpi_free(&RP.Z);
    mbedtls_mpi_free(&local_48);
    if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
      return iVar1;
    }
    if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
      return iVar1;
    }
  }
  mbedtls_mpi_init(&A);
  mbedtls_mpi_init(&AA);
  iVar1 = mbedtls_mpi_get_bit(&grp->N,0);
  if (iVar1 != 1) {
    return -0x4f80;
  }
  uVar7 = grp->nbits;
  iVar1 = mbedtls_mpi_cmp_mpi(&P->Y,&(grp->G).Y);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_cmp_mpi(&P->X,&(grp->G).X);
    bVar13 = iVar1 == 0;
  }
  else {
    bVar13 = false;
  }
  bVar4 = (0x17f < uVar7 | 4U) + bVar13;
  uVar7 = 2;
  if ((ulong)bVar4 < grp->nbits) {
    uVar7 = (ulong)bVar4;
  }
  uVar5 = 1 << ((uchar)uVar7 - 1 & 0x1f);
  uVar3 = (grp->nbits + uVar7) - 1;
  d = uVar3 / uVar7;
  local_28c = (byte)uVar5;
  if ((bVar13 == false) || (local_298 = grp->T, local_298 == (mbedtls_ecp_point *)0x0)) {
    local_298 = (mbedtls_ecp_point *)calloc((ulong)uVar5,0x48);
    if (local_298 == (mbedtls_ecp_point *)0x0) {
      iVar1 = -0x4d80;
      goto LAB_00123047;
    }
    iVar1 = mbedtls_ecp_copy(local_298,P);
    if (iVar1 == 0) {
      uVar10 = 1;
      uVar12 = 0;
      do {
        pmVar6 = local_298 + uVar10;
        iVar1 = mbedtls_ecp_copy(pmVar6,local_298 + (uVar10 >> 1));
        if (iVar1 != 0) goto LAB_00123003;
        uVar8 = d;
        if (uVar7 <= uVar3) {
          do {
            iVar1 = ecp_double_jac(grp,pmVar6,pmVar6);
            if (iVar1 != 0) goto LAB_00123003;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar8 = (ulong)(byte)((char)uVar12 + 1);
        *(mbedtls_ecp_point **)(&RP.X.s + uVar12 * 2) = pmVar6;
        uVar9 = (int)uVar10 * 2 & 0xff;
        uVar10 = (ulong)uVar9;
        uVar12 = uVar8;
      } while (uVar9 < uVar5);
      iVar1 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&RP,uVar8);
      if (iVar1 == 0) {
        uVar3 = 1;
        bVar4 = 0;
        do {
          uVar12 = uVar3 & 0xff;
          iVar2 = (int)uVar12;
          if ((char)uVar3 != '\0') {
            lVar11 = (ulong)(uint)(iVar2 * 8) * 9;
            pmVar6 = (mbedtls_ecp_point *)((long)&local_298[-1].X.s + lVar11);
            R_00 = (mbedtls_ecp_point *)((long)&local_298[-1].X.s + (ulong)(uint)(iVar2 * 0x90));
            do {
              iVar1 = ecp_add_mixed(grp,R_00,pmVar6,
                                    (mbedtls_ecp_point *)((long)&(local_298->X).s + lVar11));
              if (iVar1 != 0) goto LAB_00123003;
              uVar12 = uVar12 - 1;
              uVar3 = (ulong)bVar4;
              bVar4 = bVar4 + 1;
              *(mbedtls_ecp_point **)(&RP.X.s + uVar3 * 2) = R_00;
              pmVar6 = pmVar6 + -1;
              R_00 = R_00 + -1;
            } while (uVar12 != 0);
          }
          uVar3 = (ulong)(uint)(iVar2 * 2);
        } while ((byte)(iVar2 * 2) < local_28c);
        iVar1 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&RP,(ulong)bVar4);
        if (iVar1 == 0) {
          if (bVar13 != false) {
            grp->T = local_298;
            grp->T_size = (ulong)uVar5;
          }
          goto LAB_00122eb4;
        }
      }
    }
  }
  else {
LAB_00122eb4:
    iVar2 = mbedtls_mpi_get_bit(m,0);
    iVar1 = mbedtls_mpi_copy(&A,m);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_sub_mpi(&AA,&grp->N,m), iVar1 == 0)) {
      iVar1 = mbedtls_mpi_safe_cond_assign(&A,&AA,iVar2 != 1);
      if (iVar1 == 0) {
        ecp_comb_fixed((uchar *)&RP,d,(uchar)uVar7,&A);
        iVar1 = ecp_mul_comb_core(grp,R,local_298,local_28c,(uchar *)&RP,d,f_rng,p_rng);
        if ((iVar1 == 0) && (iVar1 = ecp_safe_invert_jac(grp,R,iVar2 != 1), iVar1 == 0)) {
          iVar1 = ecp_normalize_jac(grp,R);
        }
      }
    }
  }
LAB_00123003:
  if (bVar13 == false) {
    lVar11 = 0;
    do {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(local_298->X).s + lVar11));
      lVar11 = lVar11 + 0x48;
    } while ((ulong)((uVar5 & 0xff) + (uint)((uVar5 & 0xff) == 0)) * 0x48 != lVar11);
    free(local_298);
  }
LAB_00123047:
  mbedtls_mpi_free(&A);
  mbedtls_mpi_free(&AA);
  if (iVar1 == 0) {
    return 0;
  }
  mbedtls_ecp_point_free(R);
  return iVar1;
LAB_00123186:
  bVar13 = pos == 0;
  pos = pos - 1;
  if (bVar13) {
    iVar1 = ecp_normalize_mxz(grp,R);
    goto LAB_001239a5;
  }
  iVar1 = mbedtls_mpi_get_bit(m,pos);
  swap = (uchar)iVar1;
  iVar1 = mbedtls_mpi_safe_cond_swap(&R->X,&RP.X,swap);
  if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_safe_cond_swap(X,&RP.Z,swap), iVar1 != 0))
  goto LAB_001239a5;
  mbedtls_mpi_init(&A);
  mbedtls_mpi_init(&AA);
  mbedtls_mpi_init(&B);
  mbedtls_mpi_init(&BB);
  mbedtls_mpi_init(&E);
  mbedtls_mpi_init(&C);
  mbedtls_mpi_init(&D);
  mbedtls_mpi_init(&DA);
  mbedtls_mpi_init(&local_90);
  iVar1 = mbedtls_mpi_add_mpi(&A,&R->X,X);
  if (iVar1 == 0) {
    do {
      iVar1 = mbedtls_mpi_cmp_mpi(&A,Y);
      if (iVar1 < 0) {
        iVar1 = mbedtls_mpi_mul_mpi(&AA,&A,&A);
        if ((iVar1 == 0) && (iVar1 = ecp_modp(&AA,grp), iVar1 == 0)) {
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_sub_mpi(&B,&R->X,X);
          goto joined_r0x001233c6;
        }
        break;
      }
      iVar1 = mbedtls_mpi_sub_abs(&A,&A,Y);
    } while (iVar1 == 0);
  }
LAB_001232c8:
  mbedtls_mpi_free(&A);
  mbedtls_mpi_free(&AA);
  mbedtls_mpi_free(&B);
  mbedtls_mpi_free(&BB);
  mbedtls_mpi_free(&E);
  mbedtls_mpi_free(&C);
  mbedtls_mpi_free(&D);
  mbedtls_mpi_free(&DA);
  mbedtls_mpi_free(&local_90);
  if (((iVar1 != 0) || (iVar1 = mbedtls_mpi_safe_cond_swap(&R->X,&RP.X,swap), iVar1 != 0)) ||
     (iVar1 = mbedtls_mpi_safe_cond_swap(X,&RP.Z,swap), iVar1 != 0)) goto LAB_001239a5;
  goto LAB_00123186;
joined_r0x001233c6:
  if (iVar1 != 0) goto LAB_001232c8;
  if ((-1 < B.s) || (iVar1 = mbedtls_mpi_cmp_int(&B,0), iVar1 == 0)) {
    iVar1 = mbedtls_mpi_mul_mpi(&BB,&B,&B);
    if ((iVar1 == 0) && (iVar1 = ecp_modp(&BB,grp), iVar1 == 0)) {
      mul_count = mul_count + 1;
      iVar1 = mbedtls_mpi_sub_mpi(&E,&AA,&BB);
      goto joined_r0x00123472;
    }
    goto LAB_001232c8;
  }
  iVar1 = mbedtls_mpi_add_mpi(&B,&B,Y);
  goto joined_r0x001233c6;
joined_r0x00123472:
  if (iVar1 != 0) goto LAB_001232c8;
  if ((-1 < E.s) || (iVar1 = mbedtls_mpi_cmp_int(&E,0), iVar1 == 0)) {
    iVar1 = mbedtls_mpi_add_mpi(&C,&RP.X,&RP.Z);
    goto joined_r0x001234e1;
  }
  iVar1 = mbedtls_mpi_add_mpi(&E,&E,Y);
  goto joined_r0x00123472;
joined_r0x001234e1:
  if (iVar1 != 0) goto LAB_001232c8;
  iVar1 = mbedtls_mpi_cmp_mpi(&C,Y);
  if (iVar1 < 0) {
    iVar1 = mbedtls_mpi_sub_mpi(&D,&RP.X,&RP.Z);
    goto joined_r0x00123549;
  }
  iVar1 = mbedtls_mpi_sub_abs(&C,&C,Y);
  goto joined_r0x001234e1;
joined_r0x00123549:
  if (iVar1 != 0) goto LAB_001232c8;
  if ((-1 < D.s) || (iVar1 = mbedtls_mpi_cmp_int(&D,0), iVar1 == 0)) {
    iVar1 = mbedtls_mpi_mul_mpi(&DA,&D,&A);
    if ((iVar1 == 0) && (iVar1 = ecp_modp(&DA,grp), iVar1 == 0)) {
      mul_count = mul_count + 1;
      iVar1 = mbedtls_mpi_mul_mpi(&local_90,&C,&B);
      if ((iVar1 == 0) && (iVar1 = ecp_modp(&local_90,grp), iVar1 == 0)) {
        mul_count = mul_count + 1;
        iVar1 = mbedtls_mpi_add_mpi(&RP.X,&DA,&local_90);
        if ((iVar1 == 0) && (iVar1 = ecp_modp(&RP.X,grp), iVar1 == 0)) {
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_mul_mpi(&RP.X,&RP.X,&RP.X);
          if ((iVar1 == 0) && (iVar1 = ecp_modp(&RP.X,grp), iVar1 == 0)) {
            mul_count = mul_count + 1;
            iVar1 = mbedtls_mpi_sub_mpi(&RP.Z,&DA,&local_90);
            goto joined_r0x001236bf;
          }
        }
      }
    }
    goto LAB_001232c8;
  }
  iVar1 = mbedtls_mpi_add_mpi(&D,&D,Y);
  goto joined_r0x00123549;
joined_r0x001236bf:
  if (iVar1 != 0) goto LAB_001232c8;
  if ((-1 < RP.Z.s) || (iVar1 = mbedtls_mpi_cmp_int(&RP.Z,0), iVar1 == 0)) {
    X_00 = &RP.Z;
    iVar1 = mbedtls_mpi_mul_mpi(X_00,X_00,X_00);
    if ((iVar1 == 0) && (iVar1 = ecp_modp(&RP.Z,grp), iVar1 == 0)) {
      mul_count = mul_count + 1;
      iVar1 = mbedtls_mpi_mul_mpi(&RP.Z,&local_48,&RP.Z);
      if ((iVar1 == 0) && (iVar1 = ecp_modp(&RP.Z,grp), iVar1 == 0)) {
        mul_count = mul_count + 1;
        iVar1 = mbedtls_mpi_mul_mpi(&R->X,&AA,&BB);
        if ((iVar1 == 0) && (iVar1 = ecp_modp(&R->X,grp), iVar1 == 0)) {
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_mul_mpi(X,&grp->A,&E);
          if ((iVar1 == 0) && (iVar1 = ecp_modp(X,grp), iVar1 == 0)) {
            mul_count = mul_count + 1;
            iVar1 = mbedtls_mpi_add_mpi(X,&BB,X);
            goto joined_r0x00123819;
          }
        }
      }
    }
    goto LAB_001232c8;
  }
  iVar1 = mbedtls_mpi_add_mpi(&RP.Z,&RP.Z,Y);
  goto joined_r0x001236bf;
joined_r0x00123819:
  if (iVar1 != 0) goto LAB_001232c8;
  iVar1 = mbedtls_mpi_cmp_mpi(X,Y);
  if (iVar1 < 0) {
    iVar1 = mbedtls_mpi_mul_mpi(X,&E,X);
    if ((iVar1 == 0) && (iVar1 = ecp_modp(X,grp), iVar1 == 0)) {
      mul_count = mul_count + 1;
      iVar1 = 0;
    }
    goto LAB_001232c8;
  }
  iVar1 = mbedtls_mpi_sub_abs(X,X,Y);
  goto joined_r0x00123819;
}

Assistant:

int mbedtls_ecp_mul( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    char is_grp_capable = 0;
#endif

    /* Common sanity checks */
    if( mbedtls_mpi_cmp_int( &P->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_check_privkey( grp, m ) ) != 0 ||
        ( ret = mbedtls_ecp_check_pubkey( grp, P ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if ( is_grp_capable = mbedtls_internal_ecp_grp_capable( grp )  )
    {
        MBEDTLS_MPI_CHK( mbedtls_internal_ecp_init( grp ) );
    }

#endif /* MBEDTLS_ECP_INTERNAL_ALT */
#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
        ret = ecp_mul_mxz( grp, R, m, P, f_rng, p_rng );

#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
        ret = ecp_mul_comb( grp, R, m, P, f_rng, p_rng );

#endif
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
cleanup:

    if ( is_grp_capable )
    {
        mbedtls_internal_ecp_free( grp );
    }

#endif /* MBEDTLS_ECP_INTERNAL_ALT */
    return( ret );
}